

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall
crypto_tests::CryptoTest::
TestVector<CHMAC_SHA256,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (CryptoTest *this,CHMAC_SHA256 *h,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *in,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *out)

{
  long lVar1;
  uchar *data;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  unsigned_long len;
  ulong uVar5;
  long lVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar10;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  assertion_result local_290;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hash;
  undefined1 local_1d8 [8];
  element_type *local_1d0;
  shared_count sStack_1c8;
  char **local_1c0;
  CSHA256 local_170;
  CHMAC_SHA256 hasher;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x25;
  file.m_begin = (iterator)&local_208;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_218,msg);
  local_1d0 = (element_type *)0x0;
  sStack_1c8.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ = "out.size() == h.OUTPUT_SIZE";
  local_290.m_message.px = (element_type *)0xb903a9;
  hasher.outer.s[2]._0_1_ = 0;
  hasher.outer.s._0_8_ = &PTR__lazy_ostream_011481f0;
  hasher.outer.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_220 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  hasher.outer.s._24_8_ = &local_290;
  local_1d8[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start == 0x20);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)&hasher,1,0,WARN,_cVar10,
             (size_t)&local_228,0x25);
  boost::detail::shared_count::~shared_count(&sStack_1c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&hash,(long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_start);
  memcpy(&hasher,h,0xd0);
  data = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  CSHA256::Write(&hasher.inner,data,
                 (long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)data);
  CHMAC_SHA256::Finalize
            (&hasher,hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x2a;
  file_00.m_begin = (iterator)&local_238;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_248,
             msg_00);
  local_1d8[0] = (class_property<bool>)std::operator==(&hash,out);
  local_1d0 = (element_type *)0x0;
  sStack_1c8.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ = "hash == out";
  local_290.m_message.px = (element_type *)0xca536e;
  hasher.outer.s[2]._0_1_ = 0;
  hasher.outer.s._0_8_ = &PTR__lazy_ostream_011481f0;
  hasher.outer.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_250 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  hasher.outer.s._24_8_ = &local_290;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)&hasher,1,0,WARN,_cVar10,
             (size_t)&local_258,0x2a);
  boost::detail::shared_count::~shared_count(&sStack_1c8);
  for (iVar4 = 0; iVar4 != 0x20; iVar4 = iVar4 + 1) {
    memcpy(&hasher,h,0xd0);
    uVar9 = 0;
    while (uVar5 = (long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_start, lVar6 = uVar5 - uVar9,
          uVar9 <= uVar5 && lVar6 != 0) {
      len = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                      (&(this->super_BasicTestingSetup).m_rng.super_RandomMixin<FastRandomContext>,
                       (lVar6 + 1U >> 1) + 1);
      CSHA256::Write(&hasher.inner,
                     (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                     .super__Vector_impl_data._M_start + uVar9,len);
      uVar9 = len + uVar9;
      if (uVar9 != 0) {
        puVar2 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = (long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
        if ((uVar5 < uVar9 + ((long)(out->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(out->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_start) * 2) &&
           (uVar9 <= uVar5 && uVar5 - uVar9 != 0)) {
          memcpy((CHMAC_SHA256 *)local_1d8,&hasher,0xd0);
          CSHA256::Write(&local_170,puVar2 + uVar9,uVar5 - uVar9);
          CHMAC_SHA256::Finalize
                    ((CHMAC_SHA256 *)local_1d8,
                     hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
          local_268 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
          ;
          local_260 = "";
          local_278 = &boost::unit_test::basic_cstring<char_const>::null;
          local_270 = &boost::unit_test::basic_cstring<char_const>::null;
          file_01.m_end = (iterator)0x37;
          file_01.m_begin = (iterator)&local_268;
          msg_01.m_end = pvVar8;
          msg_01.m_begin = pvVar7;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                     (size_t)&local_278,msg_01);
          bVar3 = std::operator==(&hash,out);
          local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(readonly_property<bool>)bVar3;
          local_290.m_message.px = (element_type *)0x0;
          local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_2a0 = "hash == out";
          local_298 = "";
          local_1d0 = (element_type *)((ulong)local_1d0 & 0xffffffffffffff00);
          local_1d8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
          sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_1c0 = &local_2a0;
          local_2b0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
          ;
          local_2a8 = "";
          pvVar7 = &DAT_00000001;
          pvVar8 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_290,(lazy_ostream *)local_1d8,1,0,WARN,_cVar10,(size_t)&local_2b0,0x37);
          boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
        }
      }
    }
    CHMAC_SHA256::Finalize
              (&hasher,hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    local_2c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_2b8 = "";
    local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x3b;
    file_02.m_begin = (iterator)&local_2c0;
    msg_02.m_end = pvVar8;
    msg_02.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2d0,
               msg_02);
    bVar3 = std::operator==(&hash,out);
    local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar3;
    local_290.m_message.px = (element_type *)0x0;
    local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_2a0 = "hash == out";
    local_298 = "";
    local_1d0 = (element_type *)((ulong)local_1d0 & 0xffffffffffffff00);
    local_1d8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
    sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1c0 = &local_2a0;
    local_2e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_2d8 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_290,(lazy_ostream *)local_1d8,1,0,WARN,_cVar10,(size_t)&local_2e0,0x3b);
    boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestVector(const Hasher &h, const In &in, const Out &out) {
    Out hash;
    BOOST_CHECK(out.size() == h.OUTPUT_SIZE);
    hash.resize(out.size());
    {
        // Test that writing the whole input string at once works.
        Hasher(h).Write((const uint8_t*)in.data(), in.size()).Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
    for (int i=0; i<32; i++) {
        // Test that writing the string broken up in random pieces works.
        Hasher hasher(h);
        size_t pos = 0;
        while (pos < in.size()) {
            size_t len = m_rng.randrange((in.size() - pos + 1) / 2 + 1);
            hasher.Write((const uint8_t*)in.data() + pos, len);
            pos += len;
            if (pos > 0 && pos + 2 * out.size() > in.size() && pos < in.size()) {
                // Test that writing the rest at once to a copy of a hasher works.
                Hasher(hasher).Write((const uint8_t*)in.data() + pos, in.size() - pos).Finalize(hash.data());
                BOOST_CHECK(hash == out);
            }
        }
        hasher.Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
}